

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::StartTesting(XmlReporter *this)

{
  byte bVar1;
  ostream *os;
  IConfig *pIVar2;
  undefined1 local_108 [47];
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [47];
  allocator local_89;
  string local_88 [48];
  XmlWriter local_58;
  XmlReporter *local_10;
  XmlReporter *this_local;
  
  local_10 = this;
  os = ReporterConfig::stream(&this->m_config);
  XmlWriter::XmlWriter(&local_58,os);
  XmlWriter::operator=(&this->m_xml,&local_58);
  XmlWriter::~XmlWriter(&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Catch",&local_89);
  XmlWriter::startElement(&this->m_xml,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  ReporterConfig::fullConfig((ReporterConfig *)local_b8);
  pIVar2 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)local_b8);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_b8 + 8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)(local_b8 + 8));
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)local_b8);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"name",&local_d9);
    ReporterConfig::fullConfig((ReporterConfig *)local_108);
    pIVar2 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)local_108);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_108 + 8);
    XmlWriter::writeAttribute(&this->m_xml,(string *)local_d8,(string *)(local_108 + 8));
    std::__cxx11::string::~string((string *)(local_108 + 8));
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)local_108);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  return;
}

Assistant:

virtual void StartTesting() {
            m_xml = XmlWriter( m_config.stream() );
            m_xml.startElement( "Catch" );
            if( !m_config.fullConfig()->name().empty() )
                m_xml.writeAttribute( "name", m_config.fullConfig()->name() );
        }